

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# button.c
# Opt level: O0

uint16_t toggle_modifiers_get_clean_mask(toggle_modifiers *modifiers,uint16_t mask)

{
  uint16_t modifier_mask;
  uint16_t mask_local;
  toggle_modifiers *modifiers_local;
  
  if (modifiers == (toggle_modifiers *)0x0) {
    modifiers_local._6_2_ = mask & 0xfffd;
  }
  else {
    modifiers_local._6_2_ =
         mask & ((modifiers->num_lock | modifiers->caps_lock | modifiers->scroll_lock) ^ 0xffff);
  }
  return modifiers_local._6_2_;
}

Assistant:

ATTR_INLINE uint16_t toggle_modifiers_get_clean_mask(const struct toggle_modifiers *modifiers,
                                                     uint16_t mask)
{
        if (modifiers == NULL) {
                // Use simple clean mask if we were unable to resolve modifiers
                return (uint16_t)(mask & ~(XCB_MOD_MASK_LOCK));
        }

        uint16_t modifier_mask
                = (modifiers->num_lock | modifiers->caps_lock | modifiers->scroll_lock);

        return (uint16_t)(mask & ~(modifier_mask));
}